

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cc
# Opt level: O2

char * OpenSSL_version(int which)

{
  if ((uint)which < 5) {
    return &DAT_001a9ed0 + *(int *)(&DAT_001a9ed0 + (ulong)(uint)which * 4);
  }
  return "not available";
}

Assistant:

const char *OpenSSL_version(int which) {
  switch (which) {
    case OPENSSL_VERSION:
      return "BoringSSL";
    case OPENSSL_CFLAGS:
      return "compiler: n/a";
    case OPENSSL_BUILT_ON:
      return "built on: n/a";
    case OPENSSL_PLATFORM:
      return "platform: n/a";
    case OPENSSL_DIR:
      return "OPENSSLDIR: n/a";
    default:
      return "not available";
  }
}